

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ev_dfg.c
# Opt level: O0

EVclient dfg_assoc_client(CManager_conflict cm,char *node_name,char *master_contact,EVmaster master,
                         EVclient_sources source_capabilities,EVclient_sinks sink_capabilities)

{
  int iVar1;
  int iVar2;
  __pid_t _Var3;
  attr_list p_Var4;
  CMFormat p_Var5;
  char *pcVar6;
  void *__ptr;
  CManager cm_00;
  void *__ptr_00;
  void *__ptr_01;
  CMConnection p_Var7;
  undefined8 uVar8;
  pthread_t pVar9;
  EVmaster_conflict in_RCX;
  char *in_RDX;
  char *in_RSI;
  CManager in_RDI;
  EVmaster in_R8;
  void *in_R9;
  timespec ts;
  int i;
  EVclient client;
  char *my_contact_str;
  attr_list contact_list;
  EVnode_join_msg msg;
  CMFormat register_msg;
  CMConnection conn;
  attr_list master_attrs;
  event_path_data evp;
  CManager_conflict in_stack_ffffffffffffff38;
  FILE *pFVar10;
  CManager_conflict in_stack_ffffffffffffff40;
  CManager in_stack_ffffffffffffff48;
  CManager in_stack_ffffffffffffff50;
  long local_a8;
  int local_9c;
  CMTraceType trace_type;
  undefined8 in_stack_ffffffffffffffb0;
  CMConnection conn_00;
  _event_path_data *p_Var11;
  EVclient local_8;
  
  p_Var11 = in_RDI->evp;
  conn_00 = (CMConnection)0x0;
  p_Var4 = INT_CMget_contact_list(in_stack_ffffffffffffff38);
  p_Var5 = INT_CMlookup_format(in_RDI,EVdfg_ready_format_list);
  if (((in_RCX == (EVmaster_conflict)0x0) || (in_RCX->client == (EVclient)0x0)) &&
     ((in_RCX != (EVmaster_conflict)0x0 || (p_Var5 == (CMFormat)0x0)))) {
    dfg_extern_map[0].extern_value = cod_EVdfg_trigger_reconfig;
    dfg_extern_map[1].extern_value = cod_EVdfg_flush_attrs;
    INT_EVadd_standard_routines
              (in_stack_ffffffffffffff50,(char *)in_stack_ffffffffffffff48,
               (cod_extern_entry *)in_stack_ffffffffffffff40);
    local_8 = (EVclient)INT_CMmalloc((size_t)in_stack_ffffffffffffff40);
    memset(local_8,0,0x50);
    local_8->cm = in_RDI;
    local_8->pending_auto_list = (auto_stone_list *)0x0;
    if (in_RDX == (char *)0x0) {
      local_8->master = in_RCX;
      local_8->dfg = in_RCX->dfg;
      if (in_RCX->dfg != (EVdfg)0x0) {
        in_RCX->dfg->client = local_8;
      }
      in_RCX->client = local_8;
    }
    else {
      conn_00 = (CMConnection)attr_list_from_string(in_RDX);
      pcVar6 = strdup(in_RDX);
      local_8->master_contact_str = pcVar6;
    }
    iVar1 = INT_CMCondition_get(in_stack_ffffffffffffff50,(CMConnection)in_stack_ffffffffffffff48);
    local_8->ready_condition = iVar1;
    if (p_Var4 == (attr_list)0x0) {
      INT_CMlisten((CManager_conflict)0x161845);
      p_Var4 = INT_CMget_contact_list(in_stack_ffffffffffffff38);
    }
    __ptr = (void *)attr_list_to_string(p_Var4);
    free_attr_list(p_Var4);
    cm_00 = (CManager)strdup(in_RSI);
    __ptr_00 = INT_CMmalloc((size_t)in_stack_ffffffffffffff40);
    for (local_9c = 0; local_9c < p_Var11->source_count; local_9c = local_9c + 1) {
      pcVar6 = strdup(p_Var11->sources[local_9c].name);
      *(char **)((long)__ptr_00 + (long)local_9c * 0x10) = pcVar6;
      *(undefined8 *)((long)__ptr_00 + (long)local_9c * 0x10 + 8) = 0;
    }
    __ptr_01 = INT_CMmalloc((size_t)in_stack_ffffffffffffff40);
    for (local_9c = 0; iVar1 = (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
        local_9c < p_Var11->sink_handler_count; local_9c = local_9c + 1) {
      pcVar6 = strdup(p_Var11->sink_handlers[local_9c].name);
      *(char **)((long)__ptr_01 + (long)local_9c * 0x10) = pcVar6;
      *(undefined8 *)((long)__ptr_01 + (long)local_9c * 0x10 + 8) = 0;
    }
    INT_EVregister_close_handler(in_RDI,dfg_stone_close_handler,local_8);
    trace_type = (CMTraceType)((ulong)p_Var4 >> 0x20);
    if (in_RCX == (EVmaster_conflict)0x0) {
      INT_CMregister_format(in_stack_ffffffffffffff48,(FMStructDescList)in_stack_ffffffffffffff40);
      INT_CMregister_format(in_stack_ffffffffffffff48,(FMStructDescList)in_stack_ffffffffffffff40);
      INT_CMregister_format(in_stack_ffffffffffffff48,(FMStructDescList)in_stack_ffffffffffffff40);
      INT_CMregister_format(in_stack_ffffffffffffff48,(FMStructDescList)in_stack_ffffffffffffff40);
      INT_CMregister_format(in_stack_ffffffffffffff48,(FMStructDescList)in_stack_ffffffffffffff40);
      INT_CMregister_format(in_stack_ffffffffffffff48,(FMStructDescList)in_stack_ffffffffffffff40);
      INT_CMregister_handler
                ((CMFormat)in_stack_ffffffffffffff50,(CMHandlerFunc)in_stack_ffffffffffffff48,
                 in_stack_ffffffffffffff40);
      INT_CMregister_format(in_stack_ffffffffffffff48,(FMStructDescList)in_stack_ffffffffffffff40);
      INT_CMregister_handler
                ((CMFormat)in_stack_ffffffffffffff50,(CMHandlerFunc)in_stack_ffffffffffffff48,
                 in_stack_ffffffffffffff40);
      INT_CMregister_format(in_stack_ffffffffffffff48,(FMStructDescList)in_stack_ffffffffffffff40);
      INT_CMregister_handler
                ((CMFormat)in_stack_ffffffffffffff50,(CMHandlerFunc)in_stack_ffffffffffffff48,
                 in_stack_ffffffffffffff40);
      p_Var7 = INT_CMget_conn(in_stack_ffffffffffffff40,(attr_list)in_stack_ffffffffffffff38);
      if (p_Var7 == (CMConnection)0x0) {
        pFVar10 = _stderr;
        uVar8 = attr_list_to_string(conn_00);
        fprintf(pFVar10,"failed to contact Master at %s\n",uVar8);
        fprintf(_stderr,"Join DFG failed\n");
        return (EVclient)0x0;
      }
      INT_CMwrite((CMConnection)in_stack_ffffffffffffff40,(CMFormat)in_stack_ffffffffffffff38,
                  (void *)0x161b73);
      local_8->master_connection = p_Var7;
      for (local_9c = 0; local_9c < p_Var11->source_count; local_9c = local_9c + 1) {
        free(*(void **)((long)__ptr_00 + (long)local_9c * 0x10));
      }
      free(__ptr_00);
      local_9c = 0;
      while( true ) {
        iVar1 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
        trace_type = (CMTraceType)((ulong)p_Var4 >> 0x20);
        if (p_Var11->sink_handler_count <= local_9c) break;
        free(*(void **)((long)__ptr_01 + (long)local_9c * 0x10));
        local_9c = local_9c + 1;
      }
      free(__ptr_01);
      free(__ptr);
      free(cm_00);
    }
    else {
      queue_master_msg(in_R8,in_R9,(EVmaster_msg_type)((ulong)p_Var11 >> 0x20),conn_00,iVar1);
      iVar1 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
    }
    iVar2 = CMtrace_val[0xd];
    if (in_RDI->CMTrace_file == (FILE *)0x0) {
      iVar2 = CMtrace_init(cm_00,trace_type);
    }
    if (iVar2 != 0) {
      if (CMtrace_PID != 0) {
        pFVar10 = (FILE *)in_RDI->CMTrace_file;
        _Var3 = getpid();
        in_stack_ffffffffffffff40 = (CManager_conflict)(long)_Var3;
        pVar9 = pthread_self();
        fprintf(pFVar10,"P%lxT%lx - ",in_stack_ffffffffffffff40,pVar9);
        iVar1 = (int)((ulong)pFVar10 >> 0x20);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&stack0xffffffffffffff50);
        fprintf((FILE *)in_RDI->CMTrace_file,"%lld.%.9ld - ",in_stack_ffffffffffffff50,local_a8);
      }
      fprintf((FILE *)in_RDI->CMTrace_file,"DFG %p node name %s\n",local_8,in_RSI);
    }
    fflush((FILE *)in_RDI->CMTrace_file);
    if (conn_00 != (CMConnection)0x0) {
      free_attr_list(conn_00);
    }
    INT_CMadd_shutdown_task
              (in_stack_ffffffffffffff50,(CMPollFunc)in_stack_ffffffffffffff48,
               in_stack_ffffffffffffff40,iVar1);
  }
  else {
    fprintf(_stderr,
            "Rejecting attempt to associate a DFG client with another DFG or with the same DFG multiple tiems.\n"
           );
    fprintf(_stderr,
            "Only one call to EVclient_assoc() or EVclient_assoc_local() per CManager allowed.\n");
    local_8 = (EVclient)0x0;
  }
  return local_8;
}

Assistant:

extern EVclient
dfg_assoc_client(CManager cm, char* node_name, char *master_contact, EVmaster master,
		 EVclient_sources source_capabilities, EVclient_sinks sink_capabilities)
{
    event_path_data evp = cm->evp;
    attr_list master_attrs = NULL;
    CMConnection conn;
    CMFormat register_msg = NULL;
    EVnode_join_msg msg;
    attr_list contact_list = INT_CMget_contact_list(cm);
    char *my_contact_str;
    EVclient client;
    int i;

    register_msg = INT_CMlookup_format(cm, EVdfg_ready_format_list);
    if ((master && master->client) ||
	(!master && register_msg)) {
	fprintf(stderr, "Rejecting attempt to associate a DFG client with another DFG or with the same DFG multiple tiems.\n");
	fprintf(stderr, "Only one call to EVclient_assoc() or EVclient_assoc_local() per CManager allowed.\n");
	return NULL;
    }
    dfg_extern_map[0].extern_value = (void*)(intptr_t)cod_EVdfg_trigger_reconfig;
    dfg_extern_map[1].extern_value = (void*)(intptr_t)cod_EVdfg_flush_attrs;

    INT_EVadd_standard_routines(cm, dfg_extern_string, dfg_extern_map);

    client = malloc(sizeof(*client));
    memset(client, 0, sizeof(*client));
    client->cm = cm;
    client->pending_auto_list = NULL;
    if (master_contact) {
	master_attrs = attr_list_from_string(master_contact);
	client->master_contact_str = strdup(master_contact);
    } else {
	client->master = master;
	client->dfg = master->dfg;
	if (master->dfg)
	    master->dfg->client = client;
	master->client = client;
    }

    client->ready_condition = INT_CMCondition_get(cm, NULL);

    if (contact_list == NULL) {
	INT_CMlisten(cm);
	contact_list = INT_CMget_contact_list(cm);
    }

    my_contact_str = attr_list_to_string(contact_list);
    free_attr_list(contact_list);
    
    msg.node_name = strdup(node_name);
    msg.contact_string = my_contact_str;
    msg.source_count = evp->source_count;
    msg.sources = malloc(msg.source_count * sizeof(msg.sources[0]));
    for (i=0; i < evp->source_count; i++) {
	msg.sources[i].name = strdup(evp->sources[i].name);
	msg.sources[i].FMtype = NULL;
    }
    msg.sink_count = evp->sink_handler_count;
    msg.sinks = malloc(msg.sink_count * sizeof(msg.sinks[0]));
    for (i=0; i < evp->sink_handler_count; i++) {
	msg.sinks[i].name = strdup(evp->sink_handlers[i].name);
	msg.sinks[i].FMtype = NULL;
    }
    INT_EVregister_close_handler(cm, dfg_stone_close_handler, (void*)client);
    
    if (master) {
	/* local master */
	queue_master_msg(master, (void*)&msg, DFGnode_join, NULL, /*copy*/0);
    } else {
	/*
	 * EVdfg client-sent messages
	 */
	register_msg = INT_CMregister_format(cm, EVdfg_node_join_format_list);
	INT_CMregister_format(cm, EVdfg_deploy_ack_format_list);
	INT_CMregister_format(cm, EVclient_shutdown_contribution_format_list);
	INT_CMregister_format(cm, EVdfg_conn_shutdown_format_list);
	INT_CMregister_format(cm, EVdfg_flush_attrs_reconfig_format_list);

	/*
	 * EVdfg client-handled messages
	 */
	INT_CMregister_handler(INT_CMregister_format(cm, EVdfg_ready_format_list),
			       dfg_ready_handler, client);
	INT_CMregister_handler(INT_CMregister_format(cm, EVdfg_deploy_format_list),
			       dfg_deploy_handler, client);
	INT_CMregister_handler(INT_CMregister_format(cm, EVclient_shutdown_format_list),
			       dfg_shutdown_handler, client);

	conn = INT_CMget_conn(cm, master_attrs);
	if (conn == NULL) {
	    fprintf(stderr, "failed to contact Master at %s\n", attr_list_to_string(master_attrs));
	    fprintf(stderr, "Join DFG failed\n");
	    return NULL;
	}
	INT_CMwrite(conn, register_msg, &msg);
	client->master_connection = conn;
	for (i=0; i < evp->source_count; i++) {
	    free(msg.sources[i].name);
	}
	free(msg.sources);
	for (i=0; i < evp->sink_handler_count; i++) {
	    free(msg.sinks[i].name);
	}
	free(msg.sinks);
	free(msg.contact_string);
	free(msg.node_name);
    }
    CMtrace_out(cm, EVdfgVerbose, "DFG %p node name %s\n", client, node_name);
    if (master_attrs) free_attr_list(master_attrs);
    INT_CMadd_shutdown_task(cm, free_client, client, FREE_TASK);
    return client;
}